

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cpp
# Opt level: O0

bool IsStandard(CScript *scriptPubKey,optional<unsigned_int> *max_datacarrier_bytes,
               TxoutType *whichType)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  bool bVar4;
  TxoutType TVar5;
  byte *pbVar6;
  uint *puVar7;
  TxoutType *in_RDX;
  long in_FS_OFFSET;
  uchar n;
  uchar m;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vSolutions;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_000000b0;
  CScript *in_stack_000000b8;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffff88;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  size_type in_stack_ffffffffffffff9c;
  bool local_21;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(in_stack_ffffffffffffff88);
  TVar5 = Solver(in_stack_000000b8,in_stack_000000b0);
  *in_RDX = TVar5;
  if (*in_RDX == NONSTANDARD) {
    local_21 = false;
    goto LAB_00687e97;
  }
  if (*in_RDX == MULTISIG) {
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::front(in_stack_ffffffffffffff90);
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                        (size_type)in_stack_ffffffffffffff90);
    bVar1 = *pbVar6;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::back(in_stack_ffffffffffffff88);
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                        (size_type)in_stack_ffffffffffffff90);
    bVar2 = *pbVar6;
    if ((bVar2 == 0) || (3 < bVar2)) {
      local_21 = false;
      goto LAB_00687e97;
    }
    if ((bVar1 == 0) || (bVar2 < bVar1)) {
      local_21 = false;
      goto LAB_00687e97;
    }
  }
  else if (*in_RDX == NULL_DATA) {
    bVar4 = std::optional::operator_cast_to_bool
                      ((optional<unsigned_int> *)in_stack_ffffffffffffff88);
    if (bVar4) {
      in_stack_ffffffffffffff9c =
           prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                     ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      puVar7 = wallet::_GLOBAL__N_1::std::optional<unsigned_int>::operator*
                         ((optional<unsigned_int> *)in_stack_ffffffffffffff88);
      if (in_stack_ffffffffffffff9c <= *puVar7) goto LAB_00687e88;
    }
    local_21 = false;
    goto LAB_00687e97;
  }
LAB_00687e88:
  local_21 = true;
LAB_00687e97:
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool IsStandard(const CScript& scriptPubKey, const std::optional<unsigned>& max_datacarrier_bytes, TxoutType& whichType)
{
    std::vector<std::vector<unsigned char> > vSolutions;
    whichType = Solver(scriptPubKey, vSolutions);

    if (whichType == TxoutType::NONSTANDARD) {
        return false;
    } else if (whichType == TxoutType::MULTISIG) {
        unsigned char m = vSolutions.front()[0];
        unsigned char n = vSolutions.back()[0];
        // Support up to x-of-3 multisig txns as standard
        if (n < 1 || n > 3)
            return false;
        if (m < 1 || m > n)
            return false;
    } else if (whichType == TxoutType::NULL_DATA) {
        if (!max_datacarrier_bytes || scriptPubKey.size() > *max_datacarrier_bytes) {
            return false;
        }
    }

    return true;
}